

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O2

void __thiscall OrderGrid::setColors(OrderGrid *this,Palette *colors)

{
  undefined8 uVar1;
  ColorRole acr;
  QPalette *pQVar2;
  QColor *pQVar3;
  QPalette pal;
  
  pQVar2 = (QPalette *)QWidget::palette();
  QPalette::QPalette(&pal,pQVar2);
  acr = QWidget::backgroundRole();
  pQVar3 = Palette::operator[](colors,ColorBackground);
  QPalette::setColor(&pal,acr,pQVar3);
  QWidget::setPalette((QPalette *)this);
  pQVar3 = Palette::operator[](colors,ColorLine);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mLineColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mLineColor = uVar1;
  pQVar3 = Palette::operator[](colors,ColorForeground);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mRownoColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mRownoColor = uVar1;
  pQVar3 = Palette::operator[](colors,ColorForegroundHighlight1);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mTextColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mTextColor = uVar1;
  pQVar3 = Palette::operator[](colors,ColorRow);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mRowColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mRowColor = uVar1;
  pQVar3 = Palette::operator[](colors,ColorRowPlayer);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mTrackerColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mTrackerColor = uVar1;
  pQVar3 = Palette::operator[](colors,ColorCursor);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->mCursorColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->mCursorColor = uVar1;
  QColor::setAlpha((int)this + 0xa0);
  QWidget::update();
  QPalette::~QPalette(&pal);
  return;
}

Assistant:

void OrderGrid::setColors(Palette const& colors) {
    auto pal = palette();
    pal.setColor(backgroundRole(), colors[Palette::ColorBackground]);
    setPalette(pal);

    mLineColor = colors[Palette::ColorLine];
    mRownoColor = colors[Palette::ColorForeground];
    mTextColor = colors[Palette::ColorForegroundHighlight1];
    mRowColor = colors[Palette::ColorRow];
    mTrackerColor = colors[Palette::ColorRowPlayer];
    mCursorColor = colors[Palette::ColorCursor];
    mCursorColor.setAlpha(128);

    update();
}